

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coded_stream.cc
# Opt level: O3

bool __thiscall google::protobuf::io::CodedInputStream::Refresh(CodedInputStream *this)

{
  ZeroCopyInputStream *pZVar1;
  char cVar2;
  int iVar3;
  int iVar4;
  LogMessage *pLVar5;
  int iVar6;
  uint8 *puVar7;
  int iVar8;
  int buffer_size;
  void *void_buffer;
  LogFinisher local_75;
  uint local_74;
  uint8 *local_70;
  LogMessage local_68;
  
  if (*(int *)&this->buffer_end_ != *(int *)&this->buffer_) {
    internal::LogMessage::LogMessage
              (&local_68,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/hyperion-project[P]protobuf/src/google/protobuf/io/coded_stream.cc"
               ,0x1e7);
    pLVar5 = internal::LogMessage::operator<<(&local_68,"CHECK failed: (0) == (BufferSize()): ");
    internal::LogFinisher::operator=((LogFinisher *)&local_70,pLVar5);
    internal::LogMessage::~LogMessage(&local_68);
  }
  if (((this->buffer_size_after_limit_ < 1) && (this->overflow_bytes_ < 1)) &&
     (this->total_bytes_read_ != this->current_limit_)) {
    if (this->total_bytes_warning_threshold_ <= this->total_bytes_read_ &&
        -1 < this->total_bytes_warning_threshold_) {
      internal::LogMessage::LogMessage
                (&local_68,LOGLEVEL_WARNING,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/hyperion-project[P]protobuf/src/google/protobuf/io/coded_stream.cc"
                 ,0x1f9);
      pLVar5 = internal::LogMessage::operator<<
                         (&local_68,
                          "Reading dangerously large protocol message.  If the message turns out to be larger than "
                         );
      pLVar5 = internal::LogMessage::operator<<(pLVar5,this->total_bytes_limit_);
      pLVar5 = internal::LogMessage::operator<<
                         (pLVar5,
                          " bytes, parsing will be halted for security reasons.  To increase the limit (or to disable these warnings), see CodedInputStream::SetTotalBytesLimit() in google/protobuf/io/coded_stream.h."
                         );
      internal::LogFinisher::operator=((LogFinisher *)&local_70,pLVar5);
      internal::LogMessage::~LogMessage(&local_68);
      this->total_bytes_warning_threshold_ = -2;
    }
    pZVar1 = this->input_;
    do {
      iVar3 = (*pZVar1->_vptr_ZeroCopyInputStream[2])(pZVar1,&local_70,&local_74);
      cVar2 = (char)iVar3;
      if (cVar2 == '\0') {
        this->buffer_ = (uint8 *)0x0;
        this->buffer_end_ = (uint8 *)0x0;
        return false;
      }
    } while ((long)(int)local_74 == 0);
    this->buffer_ = local_70;
    this->buffer_end_ = local_70 + (int)local_74;
    if ((int)local_74 < 0) {
      internal::LogMessage::LogMessage
                (&local_68,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/hyperion-project[P]protobuf/src/google/protobuf/io/coded_stream.cc"
                 ,0x20a);
      pLVar5 = internal::LogMessage::operator<<(&local_68,"CHECK failed: (buffer_size) >= (0): ");
      internal::LogFinisher::operator=(&local_75,pLVar5);
      internal::LogMessage::~LogMessage(&local_68);
    }
    iVar3 = this->total_bytes_read_;
    iVar8 = iVar3 - (local_74 ^ 0x7fffffff);
    if (iVar8 == 0 || iVar3 < (int)(local_74 ^ 0x7fffffff)) {
      iVar3 = local_74 + iVar3;
      puVar7 = this->buffer_end_;
    }
    else {
      this->overflow_bytes_ = iVar8;
      puVar7 = this->buffer_end_ + -(long)iVar8;
      this->buffer_end_ = puVar7;
      iVar3 = 0x7fffffff;
    }
    this->total_bytes_read_ = iVar3;
    this->buffer_end_ = puVar7 + this->buffer_size_after_limit_;
    iVar8 = this->current_limit_;
    if (this->total_bytes_limit_ < this->current_limit_) {
      iVar8 = this->total_bytes_limit_;
    }
    iVar4 = iVar3 - iVar8;
    iVar6 = 0;
    if (iVar4 != 0 && iVar8 <= iVar3) {
      this->buffer_end_ = puVar7 + this->buffer_size_after_limit_ + -(long)iVar4;
      iVar6 = iVar4;
    }
    this->buffer_size_after_limit_ = iVar6;
  }
  else {
    cVar2 = '\0';
    if ((this->total_bytes_limit_ <= this->total_bytes_read_ - this->buffer_size_after_limit_) &&
       (cVar2 = '\0', this->total_bytes_limit_ != this->current_limit_)) {
      PrintTotalBytesLimitError(this);
      cVar2 = '\0';
    }
  }
  return (bool)cVar2;
}

Assistant:

bool CodedInputStream::Refresh() {
  GOOGLE_DCHECK_EQ(0, BufferSize());

  if (buffer_size_after_limit_ > 0 || overflow_bytes_ > 0 ||
      total_bytes_read_ == current_limit_) {
    // We've hit a limit.  Stop.
    int current_position = total_bytes_read_ - buffer_size_after_limit_;

    if (current_position >= total_bytes_limit_ &&
        total_bytes_limit_ != current_limit_) {
      // Hit total_bytes_limit_.
      PrintTotalBytesLimitError();
    }

    return false;
  }

  if (total_bytes_warning_threshold_ >= 0 &&
      total_bytes_read_ >= total_bytes_warning_threshold_) {
      GOOGLE_LOG(WARNING) << "Reading dangerously large protocol message.  If the "
                      "message turns out to be larger than "
                   << total_bytes_limit_ << " bytes, parsing will be halted "
                      "for security reasons.  To increase the limit (or to "
                      "disable these warnings), see "
                      "CodedInputStream::SetTotalBytesLimit() in "
                      "google/protobuf/io/coded_stream.h.";

    // Don't warn again for this stream, and print total size at the end.
    total_bytes_warning_threshold_ = -2;
  }

  const void* void_buffer;
  int buffer_size;
  if (NextNonEmpty(input_, &void_buffer, &buffer_size)) {
    buffer_ = reinterpret_cast<const uint8*>(void_buffer);
    buffer_end_ = buffer_ + buffer_size;
    GOOGLE_CHECK_GE(buffer_size, 0);

    if (total_bytes_read_ <= INT_MAX - buffer_size) {
      total_bytes_read_ += buffer_size;
    } else {
      // Overflow.  Reset buffer_end_ to not include the bytes beyond INT_MAX.
      // We can't get that far anyway, because total_bytes_limit_ is guaranteed
      // to be less than it.  We need to keep track of the number of bytes
      // we discarded, though, so that we can call input_->BackUp() to back
      // up over them on destruction.

      // The following line is equivalent to:
      //   overflow_bytes_ = total_bytes_read_ + buffer_size - INT_MAX;
      // except that it avoids overflows.  Signed integer overflow has
      // undefined results according to the C standard.
      overflow_bytes_ = total_bytes_read_ - (INT_MAX - buffer_size);
      buffer_end_ -= overflow_bytes_;
      total_bytes_read_ = INT_MAX;
    }

    RecomputeBufferLimits();
    return true;
  } else {
    buffer_ = NULL;
    buffer_end_ = NULL;
    return false;
  }
}